

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O3

vm_obj_id_t CVmObjTimeZone::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t obj_id;
  int iVar1;
  CVmTimeZone *pCVar2;
  undefined8 *puVar3;
  undefined4 extraout_var;
  
  pCVar2 = parse_ctor_args(sp_ + -1,argc);
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  puVar3 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar3 = &PTR_get_metaclass_reg_00364918;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,puVar3);
  *(undefined8 *)CONCAT44(extraout_var,iVar1) = pCVar2;
  puVar3[1] = (undefined8 *)CONCAT44(extraout_var,iVar1);
  return obj_id;
}

Assistant:

void CVmObjTimeZone::set_prop(VMG_ class CVmUndo *undo,
                              vm_obj_id_t self, vm_prop_id_t prop,
                              const vm_val_t *val)
{
    /* no settable properties - throw an error */
    err_throw(VMERR_INVALID_SETPROP);
}